

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

void __thiscall Compiler::writeNBytes(Compiler *this,void *addr,int count)

{
  char *pcVar1;
  Error *this_00;
  ulong uVar2;
  allocator<char> local_41;
  char bytes [8];
  string local_38;
  
  if (count - 1U < 8) {
    pcVar1 = bytes;
    uVar2 = (ulong)(uint)count;
    while (uVar2 != 0) {
      *pcVar1 = *(char *)((long)addr + (uVar2 - 1));
      pcVar1 = pcVar1 + 1;
      uVar2 = uVar2 - 1;
    }
    std::ostream::write((char *)this->_wtr,(long)bytes);
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"compiler error",&local_41)
  ;
  Error::Error(this_00,&local_38);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

void Compiler::writeNBytes(void* addr, int count) {
	char bytes[8];
	if (!(0 < count && count <= 8)) {
		throw Error("compiler error");
	}
	char* p = reinterpret_cast<char*>(addr) + (count - 1);
	for (int i = 0; i < count; ++i) {
		bytes[i] = *p--;
	}
	_wtr.write(bytes, count);
}